

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VectorsTests.cpp
# Opt level: O1

void __thiscall
VectorsTest_Int3OperatorOutput_Test::TestBody(VectorsTest_Int3OperatorOutput_Test *this)

{
  bool bVar1;
  ostream *poVar2;
  char *message;
  AssertionResult gtest_ar;
  ostringstream os;
  AssertHelper AStack_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  internal local_190 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  ostringstream local_180 [112];
  ios_base local_110 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_180,"(",1);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)local_180,2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,-1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            (local_190,"\"(2, -1, 0)\"","os.str()",(char (*) [11])"(2, -1, 0)",&local_1b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if (local_190[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1b0);
    if (local_188.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      message = "";
    }
    else {
      message = ((local_188.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1b8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/math/VectorsTests.cpp"
               ,0xbf,message);
    testing::internal::AssertHelper::operator=(&AStack_1b8,(Message *)&local_1b0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1b8);
    if ((long *)local_1b0._M_dataplus._M_p != (long *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)local_1b0._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1b0._M_dataplus._M_p + 8))();
      }
      local_1b0._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_188,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  std::ios_base::~ios_base(local_110);
  return;
}

Assistant:

TEST(VectorsTest, Int3OperatorOutput)
{
    std::ostringstream os;
    os << Int3(2, -1, 0);
    ASSERT_EQ("(2, -1, 0)", os.str());
}